

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O3

void aom_highbd_dc_top_predictor_16x32_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  int iVar1;
  uint16_t *puVar2;
  ushort uVar3;
  short sVar6;
  ushort uVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar4 [16];
  short sVar10;
  undefined1 auVar5 [16];
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar11 [16];
  short sVar15;
  undefined1 auVar17 [16];
  undefined1 auVar20 [16];
  short sVar16;
  short sVar18;
  short sVar19;
  short sVar21;
  
  auVar4 = *(undefined1 (*) [16])above;
  auVar5 = *(undefined1 (*) [16])(above + 8);
  sVar16 = auVar4._8_2_;
  auVar17._0_2_ = sVar16 + auVar4._0_2_;
  sVar9 = auVar4._10_2_;
  auVar17._2_2_ = sVar9 + auVar4._2_2_;
  sVar18 = auVar4._12_2_;
  auVar17._4_2_ = sVar18 + auVar4._4_2_;
  sVar10 = auVar4._14_2_;
  auVar17._6_2_ = sVar10 + auVar4._6_2_;
  auVar17._8_2_ = sVar16;
  auVar17._10_2_ = sVar9;
  auVar17._12_2_ = sVar18;
  auVar17._14_2_ = sVar10;
  auVar4 = pshuflw(auVar4,auVar17,0xe);
  sVar6 = auVar4._2_2_ + auVar17._2_2_;
  sVar8 = auVar4._6_2_ + auVar17._6_2_;
  sVar9 = auVar4._10_2_ + sVar9;
  sVar10 = auVar4._14_2_ + sVar10;
  sVar19 = auVar5._8_2_;
  auVar20._0_2_ = sVar19 + auVar5._0_2_;
  sVar14 = auVar5._10_2_;
  auVar20._2_2_ = sVar14 + auVar5._2_2_;
  sVar21 = auVar5._12_2_;
  auVar20._4_2_ = sVar21 + auVar5._4_2_;
  sVar15 = auVar5._14_2_;
  auVar20._6_2_ = sVar15 + auVar5._6_2_;
  auVar20._8_2_ = sVar19;
  auVar20._10_2_ = sVar14;
  auVar20._12_2_ = sVar21;
  auVar20._14_2_ = sVar15;
  auVar11 = pshuflw(auVar5,auVar20,0xe);
  sVar12 = auVar11._2_2_ + auVar20._2_2_;
  sVar13 = auVar11._6_2_ + auVar20._6_2_;
  sVar14 = auVar11._10_2_ + sVar14;
  sVar15 = auVar11._14_2_ + sVar15;
  auVar5._2_2_ = sVar6 + sVar12;
  auVar5._6_2_ = sVar8 + sVar13;
  auVar5._10_2_ = sVar9 + sVar14;
  auVar5._14_2_ = sVar10 + sVar15;
  auVar5._0_2_ = auVar4._0_2_ + auVar17._0_2_ + auVar11._0_2_ + auVar20._0_2_ + sVar6 + sVar12 + 8;
  auVar5._4_2_ = auVar4._4_2_ + auVar17._4_2_ + auVar11._4_2_ + auVar20._4_2_ + sVar8 + sVar13 + 8;
  auVar5._8_2_ = auVar4._8_2_ + sVar16 + auVar11._8_2_ + sVar19 + sVar9 + sVar14 + 8;
  auVar5._12_2_ = auVar4._12_2_ + sVar18 + auVar11._12_2_ + sVar21 + sVar10 + sVar15 + 8;
  auVar4 = pshuflw(auVar5,auVar5,0);
  uVar3 = auVar4._0_2_;
  uVar7 = auVar4._2_2_;
  puVar2 = dst + 8;
  iVar1 = 0x20;
  do {
    puVar2[-8] = uVar3 >> 4;
    puVar2[-7] = uVar7 >> 4;
    puVar2[-6] = uVar3 >> 4;
    puVar2[-5] = uVar7 >> 4;
    puVar2[-4] = uVar3 >> 4;
    puVar2[-3] = uVar7 >> 4;
    puVar2[-2] = uVar3 >> 4;
    puVar2[-1] = uVar7 >> 4;
    *puVar2 = uVar3 >> 4;
    puVar2[1] = uVar7 >> 4;
    puVar2[2] = uVar3 >> 4;
    puVar2[3] = uVar7 >> 4;
    puVar2[4] = uVar3 >> 4;
    puVar2[5] = uVar7 >> 4;
    puVar2[6] = uVar3 >> 4;
    puVar2[7] = uVar7 >> 4;
    puVar2 = puVar2 + stride;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void aom_highbd_dc_top_predictor_16x32_sse2(uint16_t *dst, ptrdiff_t stride,
                                            const uint16_t *above,
                                            const uint16_t *left, int bd) {
  const __m128i eight = _mm_cvtsi32_si128(8);
  const __m128i sum = dc_sum_16(above);
  const __m128i dc = _mm_srli_epi16(_mm_add_epi16(sum, eight), 4);
  (void)left;
  (void)bd;
  dc_store_16xh(dst, stride, 32, &dc);
}